

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *this_00;
  uint uVar2;
  element_type *peVar3;
  int iVar4;
  stringstream *this_01;
  size_t sVar5;
  stringstream *this_02;
  long lVar6;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  string error_message;
  DummyMatchResultListener dummy;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&local_208,this);
  this_01 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_01);
  poVar1 = (ostream *)(this_01 + 0x10);
  *(undefined8 *)(this_01 + *(long *)(*(long *)(this_01 + 0x10) + -0x18) + 0x18) = 0x11;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  pcVar9 = this->statement_;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "(null)";
    sVar5 = 6;
  }
  else {
    sVar5 = strlen(pcVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      local_1a8[0]._M_string_length = 0;
      local_1a8[0]._M_dataplus._M_p = (pointer)&PTR__MatchResultListener_0013dbf0;
      peVar3 = (this->matcher_).
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar4 = (*(peVar3->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                        (peVar3,&local_208);
      bVar7 = true;
      if ((char)iVar4 != '\0') goto LAB_0011e27b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      peVar3 = (this->matcher_).
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*(peVar3->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])
                (peVar3,local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected error.\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_1c8,&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_0011e279;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
    uVar2 = this->status_;
    this_02 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_02);
    this_00 = (ostream *)(this_02 + 0x10);
    *(undefined8 *)(this_02 + *(long *)(*(long *)(this_02 + 0x10) + -0x18) + 0x18) = 0x11;
    uVar8 = uVar2 & 0x7f;
    if (uVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Exited with exit status ",0x18);
      uVar8 = uVar2 >> 8 & 0xff;
LAB_0011e391:
      std::ostream::operator<<((ostream *)this_00,uVar8);
    }
    else if (0x1ffffff < (int)(uVar8 * 0x1000000 + 0x1000000)) {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Terminated by signal ",0x15);
      goto LAB_0011e391;
    }
    if ((char)uVar2 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(this_00," (core dumped)",0xe);
    }
    StringStreamToString(local_1a8,(stringstream *)this_02);
    (**(code **)(*(long *)this_02 + 8))(this_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_1e8,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0011e227;
  case LIVED:
    pcVar9 = "    Result: failed to die.\n";
    lVar6 = 0x1b;
    break;
  case RETURNED:
    pcVar9 = "    Result: illegal return in test statement.\n";
    lVar6 = 0x2e;
    break;
  case THREW:
    pcVar9 = "    Result: threw an exception.\n";
    lVar6 = 0x20;
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_1a8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x264);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_1a8);
    goto LAB_0011e279;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
  FormatDeathTestOutput(local_1a8,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
LAB_0011e227:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
LAB_0011e279:
  bVar7 = false;
LAB_0011e27b:
  StringStreamToString(local_1a8,(stringstream *)this_01);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)this_01 + 8))(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}